

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

float __thiscall
Rml::ElementStyle::ResolveNumericValue(ElementStyle *this,NumericValue value,float base_value)

{
  code *pcVar1;
  bool bVar2;
  Units units;
  float base_value_local;
  ElementStyle *this_local;
  Units UStack_10;
  NumericValue value_local;
  
  UStack_10 = value.unit;
  this_local._4_4_ = value.number;
  if (UStack_10 == PX) {
    value_local.number = this_local._4_4_;
  }
  else {
    units = operator&(UStack_10,LENGTH);
    bVar2 = Any(units);
    if (bVar2) {
      value_local.number = ComputeLength(value,this->element);
    }
    else if (UStack_10 == NUMBER) {
      value_local.number = this_local._4_4_ * base_value;
    }
    else if (UStack_10 == PERCENT) {
      value_local.number = this_local._4_4_ * base_value * 0.01;
    }
    else if (UStack_10 == X) {
      value_local.number = this_local._4_4_;
    }
    else if ((UStack_10 == DEG) || (UStack_10 == RAD)) {
      value_local.number = ComputeAngle(value);
    }
    else {
      bVar2 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementStyle.cpp"
                     ,0x18e);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      value_local.number = 0.0;
    }
  }
  return value_local.number;
}

Assistant:

float ElementStyle::ResolveNumericValue(NumericValue value, float base_value) const
{
	if (value.unit == Unit::PX)
		return value.number;
	else if (Any(value.unit & Unit::LENGTH))
		return ComputeLength(value, element);

	switch (value.unit)
	{
	case Unit::NUMBER: return value.number * base_value;
	case Unit::PERCENT: return value.number * base_value * 0.01f;
	case Unit::X: return value.number;
	case Unit::DEG:
	case Unit::RAD: return ComputeAngle(value);
	default: break;
	}

	RMLUI_ERROR;
	return 0.f;
}